

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrCreateActionSpace(XrSession session,XrActionSpaceCreateInfo *createInfo,XrSpace *space)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  XrSpace *space_local;
  XrActionSpaceCreateInfo *createInfo_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)space;
  space_local = (XrSpace *)createInfo;
  createInfo_local = (XrActionSpaceCreateInfo *)session;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrCreateActionSpace");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->CreateActionSpace)
                         ((XrSession)createInfo_local,(XrActionSpaceCreateInfo *)space_local,
                          (XrSpace *)loader_instance);
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrCreateActionSpace(
    XrSession                                   session,
    const XrActionSpaceCreateInfo*              createInfo,
    XrSpace*                                    space) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrCreateActionSpace");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->CreateActionSpace(session, createInfo, space);
    }
    return result;
}